

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_device_api.cc
# Opt level: O3

void * __thiscall
tvm::runtime::CPUDeviceAPI::AllocDataSpace
          (CPUDeviceAPI *this,TVMContext ctx,size_t nbytes,size_t alignment,TVMType type_hint)

{
  void *pvVar1;
  
  pvVar1 = calloc(nbytes,1);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/cpu_device_api.cc"
                ,0x3f,
                "virtual void *tvm::runtime::CPUDeviceAPI::AllocDataSpace(TVMContext, size_t, size_t, TVMType)"
               );
}

Assistant:

void *AllocDataSpace(TVMContext ctx,
                       size_t nbytes,
                       size_t alignment,
                       TVMType type_hint) final {
    void *ptr;
#if _MSC_VER
    ptr = _aligned_malloc(nbytes, alignment);
    if (ptr == nullptr)
      throw std::bad_alloc();
#elif defined(_LIBCPP_SGX_CONFIG) || (defined(__ANDROID__) && __ANDROID_API__ < 16)
    ptr = memalign(alignment, nbytes);
    if (ptr == nullptr)
      throw std::bad_alloc();
#else
    /* [RISCV-DLR] crucial calloc */
    ptr = calloc(nbytes, sizeof(char));
    if (ptr == nullptr)
      assert(0);
      // posix_memalign is available in android ndk since __ANDROID_API__ >= 16
      //int ret = posix_memalign(&ptr, alignment, nbytes);
      //if (ret != 0) throw std::bad_alloc();
#endif
    return ptr;
  }